

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling_sse2.c
# Opt level: O1

void WebPInitYUV444ConvertersSSE2(void)

{
  WebPYUV444Converters[1] = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[3] = Yuv444ToBgra_SSE2;
  WebPYUV444Converters[7] = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[8] = Yuv444ToBgra_SSE2;
  WebPYUV444Converters[0] = Yuv444ToRgb_SSE2;
  WebPYUV444Converters[2] = Yuv444ToBgr_SSE2;
  WebPYUV444Converters[4] = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[5] = Yuv444ToRgba4444_SSE2;
  WebPYUV444Converters[6] = Yuv444ToRgb565_SSE2;
  WebPYUV444Converters[9] = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[10] = Yuv444ToRgba4444_SSE2;
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void WebPInitYUV444ConvertersSSE2(void) {
  WebPYUV444Converters[MODE_RGBA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_BGRA]      = Yuv444ToBgra_SSE2;
  WebPYUV444Converters[MODE_rgbA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_bgrA]      = Yuv444ToBgra_SSE2;
#if !defined(WEBP_REDUCE_CSP)
  WebPYUV444Converters[MODE_RGB]       = Yuv444ToRgb_SSE2;
  WebPYUV444Converters[MODE_BGR]       = Yuv444ToBgr_SSE2;
  WebPYUV444Converters[MODE_ARGB]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_RGBA_4444] = Yuv444ToRgba4444_SSE2;
  WebPYUV444Converters[MODE_RGB_565]   = Yuv444ToRgb565_SSE2;
  WebPYUV444Converters[MODE_Argb]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_rgbA_4444] = Yuv444ToRgba4444_SSE2;
#endif   // WEBP_REDUCE_CSP
}